

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O0

LYD_FORMAT detect_data_format(char *filepath)

{
  int iVar1;
  ushort **ppuVar2;
  ulong local_20;
  size_t len;
  char *filepath_local;
  
  local_20 = strlen(filepath);
  while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)filepath[local_20 - 1]] & 0x2000) != 0) {
    local_20 = local_20 - 1;
    filepath[local_20] = '\0';
  }
  if ((4 < local_20) && (iVar1 = strcmp(filepath + (local_20 - 4),".xml"), iVar1 == 0)) {
    return LYD_XML;
  }
  if ((5 < local_20) && (iVar1 = strcmp(filepath + (local_20 - 5),".json"), iVar1 == 0)) {
    return LYD_JSON;
  }
  if ((4 < local_20) && (iVar1 = strcmp(filepath + (local_20 - 4),".lyb"), iVar1 == 0)) {
    return LYD_LYB;
  }
  return LYD_UNKNOWN;
}

Assistant:

static LYD_FORMAT
detect_data_format(char *filepath)
{
    size_t len;

    /* detect input format according to file suffix */
    len = strlen(filepath);
    for (; isspace(filepath[len - 1]); len--, filepath[len] = '\0'); /* remove trailing whitespaces */
    if (len >= 5 && !strcmp(&filepath[len - 4], ".xml")) {
        return LYD_XML;
    } else if (len >= 6 && !strcmp(&filepath[len - 5], ".json")) {
        return LYD_JSON;
    } else if (len >= 5 && !strcmp(&filepath[len - 4], ".lyb")) {
        return LYD_LYB;
    } else {
        return LYD_UNKNOWN;
    }
}